

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::MergeFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  UnknownFieldSet local_28;
  UnknownFieldSet other;
  CodedInputStream *input_local;
  UnknownFieldSet *this_local;
  
  other.fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       input;
  UnknownFieldSet(&local_28);
  bVar1 = internal::WireFormat::SkipMessage((CodedInputStream *)other.fields_,&local_28);
  if ((bVar1) &&
     (bVar1 = io::CodedInputStream::ConsumedEntireMessage((CodedInputStream *)other.fields_), bVar1)
     ) {
    MergeFromAndDestroy(this,&local_28);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  ~UnknownFieldSet(&local_28);
  return this_local._7_1_;
}

Assistant:

bool UnknownFieldSet::MergeFromCodedStream(io::CodedInputStream* input) {
  UnknownFieldSet other;
  if (internal::WireFormat::SkipMessage(input, &other) &&
      input->ConsumedEntireMessage()) {
    MergeFromAndDestroy(&other);
    return true;
  } else {
    return false;
  }
}